

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

GeometricObject * __thiscall Scene::intersect(Scene *this,Ray *r,double *t)

{
  uint uVar1;
  size_type sVar2;
  __shared_ptr_access<GeometricObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar3;
  reference pvVar4;
  element_type *peVar5;
  int local_3c;
  _func_int **pp_Stack_38;
  int i;
  double closest_dist;
  shared_ptr<GeometricObject> closest_obj;
  double *t_local;
  Ray *r_local;
  Scene *this_local;
  
  closest_obj.super___shared_ptr<GeometricObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t;
  std::shared_ptr<GeometricObject>::shared_ptr((shared_ptr<GeometricObject> *)&closest_dist);
  pp_Stack_38 = (_func_int **)0x40dd4c0000000000;
  for (local_3c = 0;
      sVar2 = std::
              vector<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
              ::size(&this->solid), (ulong)(long)local_3c < sVar2; local_3c = local_3c + 1) {
    this_00 = (__shared_ptr_access<GeometricObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              vector<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
              ::operator[](&this->solid,(long)local_3c);
    peVar3 = std::__shared_ptr_access<GeometricObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    uVar1 = (*peVar3->_vptr_GeometricObject[2])
                      (peVar3,r,closest_obj.
                                super___shared_ptr<GeometricObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi);
    if (((uVar1 & 1) != 0) &&
       ((double)(closest_obj.super___shared_ptr<GeometricObject,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base < (double)pp_Stack_38)) {
      pp_Stack_38 = (closest_obj.super___shared_ptr<GeometricObject,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_vptr__Sp_counted_base;
      pvVar4 = std::
               vector<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
               ::operator[](&this->solid,(long)local_3c);
      std::shared_ptr<GeometricObject>::operator=
                ((shared_ptr<GeometricObject> *)&closest_dist,pvVar4);
    }
  }
  (closest_obj.super___shared_ptr<GeometricObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = pp_Stack_38;
  peVar5 = std::__shared_ptr<GeometricObject,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<GeometricObject,_(__gnu_cxx::_Lock_policy)2> *)&closest_dist);
  std::shared_ptr<GeometricObject>::~shared_ptr((shared_ptr<GeometricObject> *)&closest_dist);
  return peVar5;
}

Assistant:

GeometricObject *Scene::intersect(Ray& r, double& t)
{
    std::shared_ptr<GeometricObject> closest_obj;
    double           closest_dist = GEOM_INFINITY;

    for(int i = 0; i < solid.size(); ++i)
        if( solid[i]->intersect(r,t) )
            if( t < closest_dist )
            {
                closest_dist = t;
                closest_obj = solid[i];
            }
    t = closest_dist;
    return closest_obj.get();
}